

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  char *pcVar1;
  FILE *__stream;
  size_t __n;
  size_t sVar2;
  int iVar3;
  uchar *mem;
  long *local_50 [2];
  long local_40 [2];
  uchar *local_30;
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Invalid argument for SaveEXRImageToFile","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_50[0]);
      *err = pcVar1;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar3 = -3;
  }
  else if (exr_header->compression_type == 0x80) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"ZFP compression is not supported in this build","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_50[0]);
      *err = pcVar1;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar3 = -10;
  }
  else {
    __stream = fopen(filename,"wb");
    if (__stream != (FILE *)0x0) {
      local_30 = (uchar *)0x0;
      __n = SaveEXRImageToMemory(exr_image,exr_header,&local_30,err);
      if (__n == 0) {
        fclose(__stream);
        return -0xc;
      }
      if (local_30 == (uchar *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = fwrite(local_30,1,__n,__stream);
      }
      free(local_30);
      fclose(__stream);
      if (sVar2 == __n) {
        return 0;
      }
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Cannot write a file","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_50[0]);
      *err = pcVar1;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar3 = -0xb;
  }
  return iVar3;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "wb");
#else
  FILE *fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    fclose(fp);
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}